

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O0

dropt_error
handle_optional_uint
          (dropt_context *context,dropt_option *option,dropt_char *optionArgument,void *dest)

{
  optional_uint *p;
  dropt_error err;
  void *dest_local;
  dropt_char *optionArgument_local;
  dropt_option *option_local;
  dropt_context *context_local;
  
  p._4_4_ = 0;
  if (dest == (void *)0x0) {
    dropt_misuse("No handler data specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/test_dropt.c"
                 ,0x8a);
    p._4_4_ = 2;
  }
  else {
    if (optionArgument != (dropt_char *)0x0) {
      p._4_4_ = dropt_handle_uint(context,option,optionArgument,(long)dest + 4);
    }
    if (p._4_4_ == 0) {
      *(undefined4 *)dest = 1;
    }
  }
  return p._4_4_;
}

Assistant:

static dropt_error
handle_optional_uint(dropt_context* context,
                     const dropt_option* option,
                     const dropt_char* optionArgument,
                     void* dest)
{
    dropt_error err = dropt_error_none;

    if (dest == NULL)
    {
        DROPT_MISUSE("No handler data specified.");
        err = dropt_error_bad_configuration;
    }
    else
    {
        optional_uint* p = dest;

        if (optionArgument != NULL)
        {
            err = dropt_handle_uint(context, option, optionArgument,
                                    &(p->value));
        }

        if (err == dropt_error_none) { p->is_set = true; }
    }

    return err;
}